

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffc2ll(char *cval,int *lval,int *status)

{
  int *status_local;
  int *lval_local;
  char *cval_local;
  undefined4 local_4;
  
  if (*status < 1) {
    if (*cval == 'T') {
      *lval = 1;
    }
    else {
      *lval = 0;
    }
    local_4 = *status;
  }
  else {
    local_4 = *status;
  }
  return local_4;
}

Assistant:

int ffc2ll(const char *cval,  /* I - string representation of the value: T or F */
           int *lval,         /* O - numerical value of the input string: 1 or 0 */
           int *status)       /* IO - error status */
/*
  convert null-terminated formatted string to a logical value
*/
{
    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (cval[0] == 'T')
        *lval = 1;
    else                
        *lval = 0;        /* any character besides T is considered false */

    return(*status);
}